

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcommands.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  App *pAVar1;
  App *this;
  ostream *poVar2;
  pointer ppAVar3;
  allocator local_569;
  _Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> local_568;
  string file;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  App app;
  
  std::__cxx11::string::string((string *)&local_3b0,"K3Pi goofit fitter",(allocator *)&file);
  std::__cxx11::string::string((string *)&local_3d0,"",(allocator *)&local_568);
  CLI::App::App(&app,&local_3b0,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string((string *)&local_3f0,"--help-all",(allocator *)&local_568);
  std::__cxx11::string::string((string *)&file,"Expand all help",&local_569);
  CLI::App::set_help_all_flag(&app,&local_3f0,&file);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string((string *)&local_410,"--random",(allocator *)&file);
  CLI::App::add_flag<const_char[17],_(CLI::detail::enabler)0>
            (&app,&local_410,(char (*) [17])"Some random flag");
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string((string *)&local_430,"start",(allocator *)&file);
  std::__cxx11::string::string((string *)&local_450,"A great subcommand",(allocator *)&local_568);
  pAVar1 = CLI::App::add_subcommand(&app,&local_430,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::string((string *)&local_470,"stop",(allocator *)&file);
  std::__cxx11::string::string
            ((string *)&local_490,"Do you really want to stop?",(allocator *)&local_568);
  this = CLI::App::add_subcommand(&app,&local_470,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  app.require_subcommand_min_ = 1;
  app.require_subcommand_max_ = 0;
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_4b0,"-f,--file",(allocator *)&local_568);
  std::__cxx11::string::string((string *)&local_4d0,"File name",&local_569);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar1,&local_4b0,&file,&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::string((string *)&local_4f0,"-c,--count",(allocator *)&local_568);
  CLI::App::add_flag<const_char[8],_(CLI::detail::enabler)0>
            (this,&local_4f0,(char (*) [8])"Counter");
  std::__cxx11::string::~string((string *)&local_4f0);
  CLI::App::parse_char_t<char>(&app,argc,argv);
  poVar2 = std::operator<<((ostream *)&std::cout,"Working on --file from start: ");
  poVar2 = std::operator<<(poVar2,(string *)&file);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"Working on --count from stop: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", direct count: ");
  std::__cxx11::string::string((string *)&local_510,"--count",(allocator *)&local_568);
  CLI::App::count(this,&local_510);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)&local_510);
  poVar2 = std::operator<<((ostream *)&std::cout,"Count of --random flag: ");
  std::__cxx11::string::string((string *)&local_530,"--random",(allocator *)&local_568);
  CLI::App::count(&app,&local_530);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)&local_530);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_568,&app.parsed_subcommands_)
  ;
  for (ppAVar3 = local_568._M_impl.super__Vector_impl_data._M_start;
      ppAVar3 != local_568._M_impl.super__Vector_impl_data._M_finish; ppAVar3 = ppAVar3 + 1) {
    pAVar1 = *ppAVar3;
    poVar2 = std::operator<<((ostream *)&std::cout,"Subcommand: ");
    poVar2 = std::operator<<(poVar2,(string *)&pAVar1->name_);
    std::operator<<(poVar2,'\n');
  }
  CLI::std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_568);
  std::__cxx11::string::~string((string *)&file);
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("K3Pi goofit fitter");
    app.set_help_all_flag("--help-all", "Expand all help");
    app.add_flag("--random", "Some random flag");
    CLI::App *start = app.add_subcommand("start", "A great subcommand");
    CLI::App *stop = app.add_subcommand("stop", "Do you really want to stop?");
    app.require_subcommand();  // 1 or more

    std::string file;
    start->add_option("-f,--file", file, "File name");

    CLI::Option *s = stop->add_flag("-c,--count", "Counter");

    CLI11_PARSE(app, argc, argv);

    std::cout << "Working on --file from start: " << file << '\n';
    std::cout << "Working on --count from stop: " << s->count() << ", direct count: " << stop->count("--count") << '\n';
    std::cout << "Count of --random flag: " << app.count("--random") << '\n';
    for(auto *subcom : app.get_subcommands())
        std::cout << "Subcommand: " << subcom->get_name() << '\n';

    return 0;
}